

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingScanState<unsigned_short,_short>::LoadNextGroup
          (BitpackingScanState<unsigned_short,_short> *this)

{
  char cVar1;
  data_ptr_t pdVar2;
  undefined8 uVar3;
  unsigned_long uVar4;
  string *msg;
  long in_RDI;
  string *in_stack_ffffffffffffff58;
  InternalException *in_stack_ffffffffffffff60;
  allocator *this_00;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  bitpacking_metadata_t in_stack_ffffffffffffff70;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  undefined8 local_18;
  bitpacking_metadata_t local_10;
  
  *(undefined8 *)(in_RDI + 0x1038) = 0;
  local_10 = DecodeMeta((bitpacking_metadata_encoded_t *)in_stack_ffffffffffffff58);
  *(bitpacking_metadata_t *)(in_RDI + 0x1028) = local_10;
  *(long *)(in_RDI + 0x1048) = *(long *)(in_RDI + 0x1048) + -4;
  local_18 = *(undefined8 *)(in_RDI + 0x1028);
  pdVar2 = GetPtr((BitpackingScanState<unsigned_short,_short> *)
                  CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                  in_stack_ffffffffffffff70);
  *(data_ptr_t *)(in_RDI + 0x1040) = pdVar2;
  if (*(char *)(in_RDI + 0x1028) == '\x02') {
    *(undefined2 *)(in_RDI + 0x1034) = **(undefined2 **)(in_RDI + 0x1040);
    *(long *)(in_RDI + 0x1040) = *(long *)(in_RDI + 0x1040) + 2;
  }
  else {
    if (2 < (byte)(*(char *)(in_RDI + 0x1028) - 3U)) {
      local_4d = 1;
      uVar3 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_38,"Invalid bitpacking mode",&local_39);
      InternalException::InternalException(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_4d = 0;
      __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
    }
    *(undefined2 *)(in_RDI + 0x1032) = **(undefined2 **)(in_RDI + 0x1040);
    *(long *)(in_RDI + 0x1040) = *(long *)(in_RDI + 0x1040) + 2;
  }
  cVar1 = *(char *)(in_RDI + 0x1028);
  if (cVar1 != '\x02') {
    if (cVar1 == '\x03') {
      *(undefined2 *)(in_RDI + 0x1034) = **(undefined2 **)(in_RDI + 0x1040);
      *(long *)(in_RDI + 0x1040) = *(long *)(in_RDI + 0x1040) + 2;
    }
    else {
      if (1 < (byte)(cVar1 - 4U)) {
        msg = (string *)__cxa_allocate_exception(0x10);
        this_00 = &local_71;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_70,"Invalid bitpacking mode",this_00);
        InternalException::InternalException((InternalException *)this_00,msg);
        __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
      }
      *(char *)(in_RDI + 0x1030) = (char)**(undefined2 **)(in_RDI + 0x1040);
      uVar4 = MaxValue<unsigned_long>(2,1);
      *(unsigned_long *)(in_RDI + 0x1040) = uVar4 + *(long *)(in_RDI + 0x1040);
    }
  }
  if (*(char *)(in_RDI + 0x1028) == '\x04') {
    *(undefined2 *)(in_RDI + 0x1036) = **(undefined2 **)(in_RDI + 0x1040);
    *(long *)(in_RDI + 0x1040) = *(long *)(in_RDI + 0x1040) + 2;
  }
  return;
}

Assistant:

void LoadNextGroup() {
		D_ASSERT(bitpacking_metadata_ptr > handle.Ptr() &&
		         (bitpacking_metadata_ptr < handle.Ptr() + current_segment.GetBlockManager().GetBlockSize()));
		current_group_offset = 0;
		current_group = DecodeMeta(reinterpret_cast<bitpacking_metadata_encoded_t *>(bitpacking_metadata_ptr));

		bitpacking_metadata_ptr -= sizeof(bitpacking_metadata_encoded_t);
		current_group_ptr = GetPtr(current_group);

		// Read first value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::CONSTANT_DELTA:
		case BitpackingMode::DELTA_FOR:
			current_frame_of_reference = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read second value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT_DELTA:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::DELTA_FOR:
			current_width = (bitpacking_width_t)(*reinterpret_cast<T *>(current_group_ptr));
			current_group_ptr += MaxValue(sizeof(T), sizeof(bitpacking_width_t));
			break;
		case BitpackingMode::CONSTANT:
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read third value
		if (current_group.mode == BitpackingMode::DELTA_FOR) {
			current_delta_offset = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
		}
	}